

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

bool __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::IsRecordingDeferredCommands
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this)

{
  bool bVar1;
  Uint32 UVar2;
  Char *Message;
  undefined1 local_30 [8];
  string msg;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = this;
  bVar1 = IsDeferred(this);
  if (!bVar1) {
    FormatString<char[53]>
              ((string *)local_30,
               (char (*) [53])"Only deferred contexts may record deferred commands.");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"IsRecordingDeferredCommands",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x1f6);
    std::__cxx11::string::~string((string *)local_30);
  }
  UVar2 = IndexWrapper::operator_cast_to_unsigned_int
                    ((IndexWrapper *)&this->m_DstImmediateContextId);
  return UVar2 != 0xff;
}

Assistant:

bool IsRecordingDeferredCommands() const
    {
        DEV_CHECK_ERR(IsDeferred(), "Only deferred contexts may record deferred commands.");
        return m_DstImmediateContextId != INVALID_CONTEXT_ID;
    }